

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::PluralRuleParser::getNextToken(PluralRuleParser *this,UErrorCode *status)

{
  short sVar1;
  UnicodeString *that;
  uint uVar2;
  tokenType tVar3;
  char16_t *pcVar4;
  char16_t cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint srcStart;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  that = this->ruleSrc;
  srcStart = this->ruleIndex;
  sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = (uint)sVar1;
  uVar6 = (int)uVar2 >> 5;
  uVar8 = (that->fUnion).fFields.fLength;
  uVar7 = uVar6;
  if (sVar1 < 0) {
    uVar7 = uVar8;
  }
  if ((int)srcStart < (int)uVar7) {
    lVar9 = (long)(int)srcStart;
    do {
      cVar5 = L'\xffff';
      if (srcStart < uVar7) {
        pcVar4 = (char16_t *)((long)&that->fUnion + 2);
        if ((uVar2 & 2) == 0) {
          pcVar4 = (that->fUnion).fFields.fArray;
        }
        cVar5 = pcVar4[lVar9];
      }
      tVar3 = charType(cVar5);
      this->type = tVar3;
      if (tVar3 != tSpace) {
        uVar2 = (uint)(that->fUnion).fStackFields.fLengthAndFlags;
        uVar8 = (that->fUnion).fFields.fLength;
        uVar6 = (int)uVar2 >> 5;
        break;
      }
      lVar9 = lVar9 + 1;
      srcStart = srcStart + 1;
      this->ruleIndex = srcStart;
      sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
      uVar2 = (uint)sVar1;
      uVar6 = (int)uVar2 >> 5;
      uVar8 = (that->fUnion).fFields.fLength;
      uVar7 = uVar6;
      if (sVar1 < 0) {
        uVar7 = uVar8;
      }
    } while (lVar9 < (int)uVar7);
  }
  if ((short)uVar2 < 0) {
    uVar6 = uVar8;
  }
  if ((int)uVar6 <= (int)srcStart) {
    this->type = tEOF;
    return;
  }
  switch(this->type) {
  case tNumber:
    lVar9 = (long)(int)srcStart;
    do {
      lVar9 = lVar9 + 1;
      sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar7 = (that->fUnion).fFields.fLength;
      }
      else {
        uVar7 = (int)sVar1 >> 5;
      }
      uVar8 = (uint)lVar9;
      if ((int)uVar7 <= lVar9) break;
      cVar5 = L'\xffff';
      if (uVar8 < uVar7) {
        pcVar4 = (char16_t *)((long)&that->fUnion + 2);
        if (((int)sVar1 & 2U) == 0) {
          pcVar4 = (that->fUnion).fFields.fArray;
        }
        cVar5 = pcVar4[lVar9];
      }
      tVar3 = charType(cVar5);
      this->type = tVar3;
    } while (tVar3 == tNumber);
    this->type = tNumber;
    break;
  default:
    *status = U_FMT_PARSE_ERROR_START;
  case tComma:
  case tSemiColon:
  case tColon:
  case tAt:
  case tEllipsis:
  case tMod:
  case tEqual:
  case tTilde:
    uVar8 = srcStart + 1;
    break;
  case tDot:
    uVar8 = srcStart + 1;
    if (uVar8 < uVar6 && (int)uVar8 < (int)uVar6) {
      if ((uVar2 & 2) == 0) {
        pcVar4 = (that->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&that->fUnion + 2);
      }
      if (pcVar4[(int)uVar8] == L'.') {
        uVar8 = srcStart + 2;
        if ((uVar8 < uVar6 && (int)uVar8 < (int)uVar6) && (pcVar4[(int)uVar8] == L'.')) {
          this->type = tEllipsis;
          uVar8 = srcStart + 3;
        }
        else {
          this->type = tDot2;
        }
      }
    }
    break;
  case tKeyword:
    lVar9 = (long)(int)srcStart;
    do {
      lVar9 = lVar9 + 1;
      sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar7 = (that->fUnion).fFields.fLength;
      }
      else {
        uVar7 = (int)sVar1 >> 5;
      }
      uVar8 = (uint)lVar9;
      if ((int)uVar7 <= lVar9) break;
      cVar5 = L'\xffff';
      if (uVar8 < uVar7) {
        pcVar4 = (char16_t *)((long)&that->fUnion + 2);
        if (((int)sVar1 & 2U) == 0) {
          pcVar4 = (that->fUnion).fFields.fArray;
        }
        cVar5 = pcVar4[lVar9];
      }
      tVar3 = charType(cVar5);
      this->type = tVar3;
    } while (tVar3 == tKeyword);
    this->type = tKeyword;
    break;
  case tNotEqual:
    uVar8 = srcStart + 1;
    if (uVar8 < uVar6) {
      if ((uVar2 & 2) == 0) {
        pcVar4 = (that->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&that->fUnion + 2);
      }
      if (pcVar4[(int)uVar8] == L'=') {
        uVar8 = srcStart + 2;
        break;
      }
    }
    this->type = none;
  }
  UnicodeString::UnicodeString(&local_70,that,srcStart,uVar8 - srcStart);
  UnicodeString::moveFrom(&this->token,&local_70);
  UnicodeString::~UnicodeString(&local_70);
  this->ruleIndex = uVar8;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }